

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproxQuantileScalarOperation::Finalize<short,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,short *target,AggregateFinalizeData *finalize_data)

{
  TDigest *this;
  FunctionData *pFVar1;
  reference pvVar2;
  Value source;
  Value local_20;
  
  if (state->pos != 0) {
    duckdb_tdigest::TDigest::process(state->h);
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    this = state->h;
    pvVar2 = vector<float,_true>::get<true>((vector<float,_true> *)(pFVar1 + 8),0);
    local_20 = duckdb_tdigest::TDigest::quantile(this,(double)*pvVar2);
    ApproxQuantileCoding::Decode<double,short>(&local_20,target);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.h);
		D_ASSERT(finalize_data.input.bind_data);
		state.h->compress();
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto source = state.h->quantile(bind_data.quantiles[0]);
		ApproxQuantileCoding::Decode(source, target);
	}